

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O3

int Gia_ManFaultAnalyze(sat_solver *pSat,Vec_Int_t *vPars,Vec_Int_t *vMap,Vec_Int_t *vLits,int Iter)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  Vec_Int_t *pVVar9;
  uint uVar10;
  int Lit;
  timespec ts;
  int local_60;
  uint local_5c;
  Vec_Int_t *local_58;
  uint local_4c;
  long local_48;
  timespec local_40;
  
  local_58 = vPars;
  local_4c = Iter;
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  if (local_58->nSize != vMap->nSize) {
    __assert_fail("Vec_IntSize(vPars) == Vec_IntSize(vMap)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                  ,0x4ec,
                  "int Gia_ManFaultAnalyze(sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  vLits->nSize = 0;
  uVar5 = vMap->nSize;
  if (0 < (int)uVar5) {
    lVar7 = 0;
    do {
      Vec_IntPush(vLits,vMap->pArray[lVar7]);
      lVar7 = lVar7 + 1;
      uVar5 = vMap->nSize;
    } while (lVar7 < (int)uVar5);
  }
  uVar4 = (ulong)(uint)local_58->nSize;
  iVar2 = 0;
  local_60 = 0;
  uVar10 = 0;
  local_48 = lVar6;
  if (0 < local_58->nSize) {
    lVar6 = 0;
    uVar10 = 0;
    local_60 = 0;
    pVVar9 = local_58;
    do {
      if (vLits->nSize <= lVar6) {
LAB_005982a2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (vLits->pArray[lVar6] != 0) {
        if (vLits->pArray[lVar6] != 1) {
          __assert_fail("Vec_IntEntry(vLits, v) == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                        ,0x4f4,
                        "int Gia_ManFaultAnalyze(sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                       );
        }
        if (pVVar9->pArray[lVar6] < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        uVar10 = uVar10 + 1;
        local_5c = pVVar9->pArray[lVar6] * 2;
        iVar3 = sat_solver_solve(pSat,(lit *)&local_5c,(lit *)&local_58,100,0,0,0);
        pVVar9 = local_58;
        if (iVar3 == -1) {
          if (vMap->nSize <= lVar6) goto LAB_005982a2;
          if (vMap->pArray[lVar6] != 1) {
            __assert_fail("Vec_IntEntry(vMap, v) == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                          ,0x4fd,
                          "int Gia_ManFaultAnalyze(sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                         );
          }
          vMap->pArray[lVar6] = 0;
          if ((int)local_5c < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x131,"int Abc_LitNot(int)");
          }
          local_60 = local_60 + 1;
          local_5c = local_5c ^ 1;
        }
        else if (iVar3 != 0) {
          iVar3 = local_58->nSize;
          if (0 < iVar3) {
            piVar1 = local_58->pArray;
            lVar7 = 0;
            do {
              if (vLits->nSize <= lVar7) goto LAB_005982a2;
              if (vLits->pArray[lVar7] != 0) {
                uVar5 = piVar1[lVar7];
                if (((int)uVar5 < 0) || (pSat->size <= (int)uVar5)) {
                  __assert_fail("v >= 0 && v < s->size",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                                ,0xda,"int sat_solver_var_value(sat_solver *, int)");
                }
                if (pSat->model[uVar5] == 1) {
                  vLits->pArray[lVar7] = 0;
                  iVar3 = local_58->nSize;
                }
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 < iVar3);
          }
          if (vLits->nSize <= lVar6) goto LAB_005982a2;
          if (vLits->pArray[lVar6] != 0) {
            __assert_fail("Vec_IntEntry(vLits, v) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                          ,0x507,
                          "int Gia_ManFaultAnalyze(sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                         );
          }
        }
      }
      lVar6 = lVar6 + 1;
      uVar4 = (ulong)pVVar9->nSize;
    } while (lVar6 < (long)uVar4);
    uVar5 = vMap->nSize;
  }
  if (0 < (int)uVar5) {
    uVar8 = 0;
    iVar2 = 0;
    do {
      iVar2 = iVar2 + (uint)(0 < vMap->pArray[uVar8]);
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
  }
  printf("Iteration %3d has determined %5d (out of %5d) parameters after %6d SAT calls.  ",
         (ulong)local_4c,(ulong)(uVar5 - iVar2),uVar4,(ulong)uVar10);
  iVar3 = 3;
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  lVar6 = lVar6 + local_48;
  Abc_Print(iVar3,"%s =","Time");
  Abc_Print(iVar3,"%9.2f sec\n",(double)lVar6 / 1000000.0);
  return local_60;
}

Assistant:

int Gia_ManFaultAnalyze( sat_solver * pSat, Vec_Int_t * vPars, Vec_Int_t * vMap, Vec_Int_t * vLits, int Iter )
{
    int nConfLimit = 100;
    int status, i, v, iVar, Lit;
    int nUnsats = 0, nRuns = 0;
    abctime clk = Abc_Clock();
    assert( Vec_IntSize(vPars) == Vec_IntSize(vMap) );
    // check presence of each variable
    Vec_IntClear( vLits );
    Vec_IntAppend( vLits, vMap );
    for ( v = 0; v < Vec_IntSize(vPars); v++ )
    {
        if ( !Vec_IntEntry(vLits, v) )
            continue;
        assert( Vec_IntEntry(vLits, v) == 1 );
        nRuns++;
        Lit = Abc_Var2Lit( Vec_IntEntry(vPars, v), 0 );
        status = sat_solver_solve( pSat, &Lit, &Lit+1, (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( status == l_Undef )
            continue;
        if ( status == l_False )
        {
            nUnsats++;
            assert( Vec_IntEntry(vMap, v) == 1 );
            Vec_IntWriteEntry( vMap, v, 0 );
            Lit = Abc_LitNot(Lit);
            //status = sat_solver_addclause( pSat, &Lit, &Lit+1 );
            //assert( status );
            continue;
        }
        Vec_IntForEachEntry( vPars, iVar, i )
            if ( Vec_IntEntry(vLits, i) && sat_solver_var_value(pSat, iVar) )
                Vec_IntWriteEntry( vLits, i, 0 );
        assert( Vec_IntEntry(vLits, v) == 0 );
    }
    printf( "Iteration %3d has determined %5d (out of %5d) parameters after %6d SAT calls.  ", Iter, Vec_IntSize(vMap) - Vec_IntCountPositive(vMap), Vec_IntSize(vPars), nRuns );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return nUnsats;
}